

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_ctx.c
# Opt level: O2

void BN_CTX_free(BN_CTX *c)

{
  long lVar1;
  long lVar2;
  
  if (c != (BN_CTX *)0x0) {
    CRYPTO_free(*(void **)(c + 0x20));
    *(undefined8 *)(c + 0x20) = 0;
    lVar1 = *(long *)c;
    while (lVar1 != 0) {
      for (lVar2 = 0; (int)lVar2 != 0x180; lVar2 = lVar2 + 0x18) {
        if (((BIGNUM *)(lVar1 + lVar2))->d != (ulong *)0x0) {
          BN_clear_free((BIGNUM *)(lVar1 + lVar2));
        }
      }
      *(undefined8 *)(c + 8) = *(undefined8 *)((long)*(void **)c + 0x188);
      CRYPTO_free(*(void **)c);
      lVar1 = *(long *)(c + 8);
      *(long *)c = lVar1;
    }
    CRYPTO_free(c);
    return;
  }
  return;
}

Assistant:

void BN_CTX_free(BN_CTX *ctx)
{
    if (ctx == NULL)
        return;
#ifdef BN_CTX_DEBUG
    {
        BN_POOL_ITEM *pool = ctx->pool.head;
        fprintf(stderr, "BN_CTX_free, stack-size=%d, pool-bignums=%d\n",
                ctx->stack.size, ctx->pool.size);
        fprintf(stderr, "dmaxs: ");
        while (pool) {
            unsigned loop = 0;
            while (loop < BN_CTX_POOL_SIZE)
                fprintf(stderr, "%02x ", pool->vals[loop++].dmax);
            pool = pool->next;
        }
        fprintf(stderr, "\n");
    }
#endif
    BN_STACK_finish(&ctx->stack);
    BN_POOL_finish(&ctx->pool);
    CRYPTO_free(ctx);
}